

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O2

bool __thiscall
glslang::HlslParseContext::isStructBufferMethod(HlslParseContext *this,TString *name)

{
  bool bVar1;
  
  bVar1 = std::operator==(name,"GetDimensions");
  if (!bVar1) {
    bVar1 = std::operator==(name,"Load");
    if (!bVar1) {
      bVar1 = std::operator==(name,"Load2");
      if (!bVar1) {
        bVar1 = std::operator==(name,"Load3");
        if (!bVar1) {
          bVar1 = std::operator==(name,"Load4");
          if (!bVar1) {
            bVar1 = std::operator==(name,"Store");
            if (!bVar1) {
              bVar1 = std::operator==(name,"Store2");
              if (!bVar1) {
                bVar1 = std::operator==(name,"Store3");
                if (!bVar1) {
                  bVar1 = std::operator==(name,"Store4");
                  if (!bVar1) {
                    bVar1 = std::operator==(name,"InterlockedAdd");
                    if (!bVar1) {
                      bVar1 = std::operator==(name,"InterlockedAnd");
                      if (!bVar1) {
                        bVar1 = std::operator==(name,"InterlockedCompareExchange");
                        if (!bVar1) {
                          bVar1 = std::operator==(name,"InterlockedCompareStore");
                          if (!bVar1) {
                            bVar1 = std::operator==(name,"InterlockedExchange");
                            if (!bVar1) {
                              bVar1 = std::operator==(name,"InterlockedMax");
                              if (!bVar1) {
                                bVar1 = std::operator==(name,"InterlockedMin");
                                if (!bVar1) {
                                  bVar1 = std::operator==(name,"InterlockedOr");
                                  if (!bVar1) {
                                    bVar1 = std::operator==(name,"InterlockedXor");
                                    if (!bVar1) {
                                      bVar1 = std::operator==(name,"IncrementCounter");
                                      if (!bVar1) {
                                        bVar1 = std::operator==(name,"DecrementCounter");
                                        if (!bVar1) {
                                          bVar1 = std::operator==(name,"Append");
                                          if (!bVar1) {
                                            bVar1 = std::operator==(name,"Consume");
                                            return bVar1;
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return true;
}

Assistant:

bool HlslParseContext::isStructBufferMethod(const TString& name) const
{
    return
        name == "GetDimensions"              ||
        name == "Load"                       ||
        name == "Load2"                      ||
        name == "Load3"                      ||
        name == "Load4"                      ||
        name == "Store"                      ||
        name == "Store2"                     ||
        name == "Store3"                     ||
        name == "Store4"                     ||
        name == "InterlockedAdd"             ||
        name == "InterlockedAnd"             ||
        name == "InterlockedCompareExchange" ||
        name == "InterlockedCompareStore"    ||
        name == "InterlockedExchange"        ||
        name == "InterlockedMax"             ||
        name == "InterlockedMin"             ||
        name == "InterlockedOr"              ||
        name == "InterlockedXor"             ||
        name == "IncrementCounter"           ||
        name == "DecrementCounter"           ||
        name == "Append"                     ||
        name == "Consume";
}